

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,REF_GRID to_grid)

{
  double dVar1;
  int iVar2;
  REF_INTERP ref_interp;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  REF_GRID from_grid;
  REF_DBL max_error;
  uint local_4c;
  REF_GRID local_40;
  double local_38;
  
  local_4c = ref_grid_deep_copy(&local_40,to_grid);
  if (local_4c == 0) {
    local_4c = ref_interp_create(ref_interp_ptr,local_40,to_grid);
    if (local_4c == 0) {
      ref_interp = *ref_interp_ptr;
      pRVar3 = to_grid->node;
      ref_interp->continuously = 1;
      if (0 < pRVar3->max) {
        lVar8 = 0;
        local_4c = 0;
        do {
          if ((-1 < pRVar3->global[lVar8]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar8])) {
            iVar2 = ref_interp->cell[lVar8];
            if ((long)iVar2 != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x102,"ref_interp_create_identity","identity already found?",
                     0xffffffffffffffff,(long)iVar2);
              local_4c = 1;
            }
            if (iVar2 != -1) {
              return local_4c;
            }
            if (to_grid->twod == 0) {
              uVar5 = ref_interp_exhaustive_tet_around_node
                                (ref_interp,(REF_INT)lVar8,pRVar3->real + lVar8 * 0xf,
                                 ref_interp->cell + lVar8,ref_interp->bary + lVar8 * 4);
              if (uVar5 != 0) {
                uVar6 = 0x10c;
                pcVar7 = "tet around node";
                goto LAB_0011c5e2;
              }
            }
            else {
              uVar5 = ref_interp_exhaustive_tri_around_node
                                (ref_interp,(REF_INT)lVar8,pRVar3->real + lVar8 * 0xf,
                                 ref_interp->cell + lVar8,ref_interp->bary + lVar8 * 4);
              if (uVar5 != 0) {
                uVar6 = 0x107;
                pcVar7 = "tri around node";
LAB_0011c5e2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,uVar6,"ref_interp_create_identity",(ulong)uVar5,pcVar7);
                local_4c = uVar5;
              }
            }
            if (uVar5 != 0) {
              return local_4c;
            }
            ref_interp->part[lVar8] = local_40->mpi->id;
            pRVar4 = ref_interp->bary;
            dVar1 = ref_interp->inside;
            if ((((pRVar4[lVar8 * 4] < dVar1) || (pRVar4[lVar8 * 4 + 1] < dVar1)) ||
                (pRVar4[lVar8 * 4 + 2] < dVar1)) || (pRVar4[lVar8 * 4 + 3] < dVar1)) {
              printf("info bary %e %e %e %e identity tol\n",pRVar4[lVar8 * 4],pRVar4[lVar8 * 4 + 1],
                     pRVar4[lVar8 * 4 + 2],pRVar4[lVar8 * 4 + 3]);
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pRVar3->max);
      }
      local_4c = ref_interp_max_error(ref_interp,&local_38);
      if (local_4c == 0) {
        if (to_grid->mpi->id == 0) {
          local_4c = 0;
          if (1e-12 < local_38) {
            printf("warning %e max error for identity background grid\n");
          }
        }
        else {
          local_4c = 0;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x117,"ref_interp_create_identity",(ulong)local_4c,"max error");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xf9
             ,"ref_interp_create_identity",(ulong)local_4c,"create");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xf8,
           "ref_interp_create_identity",(ulong)local_4c,"import");
  }
  return local_4c;
}

Assistant:

REF_FCN REF_STATUS ref_interp_create_identity(REF_INTERP *ref_interp_ptr,
                                              REF_GRID to_grid) {
  REF_INTERP ref_interp;
  REF_GRID from_grid;
  REF_NODE to_node;
  REF_INT node;
  REF_DBL max_error;

  RSS(ref_grid_deep_copy(&from_grid, to_grid), "import");
  RSS(ref_interp_create(ref_interp_ptr, from_grid, to_grid), "create");

  ref_interp = *ref_interp_ptr;
  to_node = ref_grid_node(to_grid);

  ref_interp_continuously(ref_interp) = REF_TRUE;

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      REIS(REF_EMPTY, ref_interp->cell[node], "identity already found?");
      if (ref_grid_twod(to_grid)) {
        RSS(ref_interp_exhaustive_tri_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tri around node");
      } else {
        RSS(ref_interp_exhaustive_tet_around_node(
                ref_interp, node, ref_node_xyz_ptr(to_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "tet around node");
      }
      ref_interp->part[node] = ref_mpi_rank(ref_grid_mpi(from_grid));
      if (!ref_interp_bary_inside(ref_interp, &(ref_interp->bary[4 * node]))) {
        printf("info bary %e %e %e %e identity tol\n",
               ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node],
               ref_interp->bary[2 + 4 * node], ref_interp->bary[3 + 4 * node]);
      }
    }
  }

  RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
  if (ref_mpi_once(ref_grid_mpi(to_grid)) && max_error > 1.0e-12) {
    printf("warning %e max error for identity background grid\n", max_error);
  }

  return REF_SUCCESS;
}